

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kissfft.hh
# Opt level: O2

void __thiscall
kissfft<double>::kf_bfly_generic(kissfft<double> *this,cpx_t *Fout,size_t fstride,size_t m,size_t p)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  undefined8 *puVar1;
  pointer pcVar2;
  pointer pcVar3;
  double dVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  cpx_t *pcVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  cpx_t *local_88;
  
  pcVar2 = (this->_twiddles).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = &this->_scratchbuf;
  if ((ulong)((long)(this->_scratchbuf).
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_scratchbuf).
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) < p) {
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(this_00,p);
  }
  local_88 = Fout;
  for (sVar12 = 0; sVar12 != m; sVar12 = sVar12 + 1) {
    lVar6 = 0;
    sVar9 = p;
    pcVar10 = local_88;
    while (bVar15 = sVar9 != 0, sVar9 = sVar9 - 1, bVar15) {
      uVar5 = *(undefined8 *)(pcVar10->_M_value + 8);
      puVar1 = (undefined8 *)
               (((this_00->
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar6);
      *puVar1 = *(undefined8 *)pcVar10->_M_value;
      puVar1[1] = uVar5;
      pcVar10 = pcVar10 + m;
      lVar6 = lVar6 + 0x10;
    }
    sVar9 = sVar12;
    for (sVar8 = 0; sVar8 != p; sVar8 = sVar8 + 1) {
      pcVar3 = (this_00->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pcVar10 = Fout + sVar9;
      uVar5 = *(undefined8 *)(pcVar3->_M_value + 8);
      *(undefined8 *)Fout[sVar9]._M_value = *(undefined8 *)pcVar3->_M_value;
      *(undefined8 *)(Fout[sVar9]._M_value + 8) = uVar5;
      lVar6 = 0x10;
      lVar14 = 0;
      lVar11 = p - 1;
      while (bVar15 = lVar11 != 0, lVar11 = lVar11 + -1, bVar15) {
        uVar13 = lVar14 + sVar9 * fstride;
        uVar7 = this->_nfft;
        if (uVar13 < uVar7) {
          uVar7 = 0;
        }
        lVar14 = uVar13 - uVar7;
        std::operator*((complex<double> *)
                       (((this->_scratchbuf).
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar6),
                       pcVar2 + lVar14);
        dVar4 = *(double *)(pcVar10->_M_value + 8);
        *(double *)pcVar10->_M_value = extraout_XMM0_Qa + *(double *)pcVar10->_M_value;
        *(double *)(pcVar10->_M_value + 8) = in_XMM1_Qa + dVar4;
        lVar6 = lVar6 + 0x10;
      }
      sVar9 = sVar9 + m;
    }
    local_88 = local_88 + 1;
  }
  return;
}

Assistant:

void kf_bfly_generic(
                cpx_t * const Fout,
                const size_t fstride,
                const std::size_t m,
                const std::size_t p
                ) const
        {
            const cpx_t * twiddles = &_twiddles[0];

            if(p > _scratchbuf.size()) _scratchbuf.resize(p);

            for ( std::size_t u=0; u<m; ++u ) {
                std::size_t k = u;
                for ( std::size_t q1=0 ; q1<p ; ++q1 ) {
                    _scratchbuf[q1] = Fout[ k  ];
                    k += m;
                }

                k=u;
                for ( std::size_t q1=0 ; q1<p ; ++q1 ) {
                    std::size_t twidx=0;
                    Fout[ k ] = _scratchbuf[0];
                    for ( std::size_t q=1;q<p;++q ) {
                        twidx += fstride * k;
                        if (twidx>=_nfft)
                          twidx-=_nfft;
                        Fout[ k ] += _scratchbuf[q] * twiddles[twidx];
                    }
                    k += m;
                }
            }
        }